

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamWriterPrivate::~BamWriterPrivate(BamWriterPrivate *this)

{
  Close(this);
  std::__cxx11::string::~string((string *)&this->m_errorString);
  BgzfStream::~BgzfStream(&this->m_stream);
  return;
}

Assistant:

BamWriterPrivate::~BamWriterPrivate()
{
    Close();
}